

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall pugi::xpath_query::~xpath_query(xpath_query *this)

{
  if ((xpath_query_impl *)this->_impl != (xpath_query_impl *)0x0) {
    impl::anon_unknown_0::xpath_query_impl::destroy((xpath_query_impl *)this->_impl);
  }
  return;
}

Assistant:

PUGI_IMPL_FN xpath_query::~xpath_query()
	{
		if (_impl)
			impl::xpath_query_impl::destroy(static_cast<impl::xpath_query_impl*>(_impl));
	}